

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (0xffffff < col) {
    IVar1 = *a;
    iVar7 = (this->_Path).Size;
    if (iVar7 == (this->_Path).Capacity) {
      if (iVar7 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar7 / 2 + iVar7;
      }
      iVar8 = iVar7 + 1;
      if (iVar7 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar5,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar8;
      iVar7 = (this->_Path).Size;
    }
    else {
      pIVar4 = (this->_Path).Data;
    }
    IVar2.y = IVar1.y + 0.5;
    IVar2.x = IVar1.x + 0.5;
    pIVar4[iVar7] = IVar2;
    iVar6 = (this->_Path).Size;
    iVar7 = iVar6 + 1;
    (this->_Path).Size = iVar7;
    IVar1 = *b;
    if (iVar7 == (this->_Path).Capacity) {
      iVar6 = iVar6 + 2;
      if (iVar7 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar7 / 2 + iVar7;
      }
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar5,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar6;
      iVar7 = (this->_Path).Size;
    }
    else {
      pIVar4 = (this->_Path).Data;
    }
    IVar3.y = IVar1.y + 0.5;
    IVar3.x = IVar1.x + 0.5;
    pIVar4[iVar7] = IVar3;
    iVar7 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar7;
    AddPolyline(this,(this->_Path).Data,iVar7,col,false,thickness);
    if ((this->_Path).Capacity < 0) {
      pIVar5 = (ImVec2 *)ImGui::MemAlloc(0);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = 0;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}